

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O0

bool __thiscall DLoadSaveMenu::Responder(DLoadSaveMenu *this,event_t *ev)

{
  short sVar1;
  FSaveGameNode *pFVar2;
  ulong uVar3;
  FFont *font;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  FBrokenLines *pFVar8;
  char *pcVar9;
  FSaveGameNode **ppFVar10;
  char *pcVar11;
  FName local_240 [4];
  FString local_230;
  FString EndString;
  char workbuf [512];
  event_t *ev_local;
  DLoadSaveMenu *this_local;
  
  if (ev->type == '\x04') {
    if (ev->subtype == '\x01') {
      uVar7 = this->Selected;
      uVar5 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames);
      if (uVar7 < uVar5) {
        sVar1 = ev->data1;
        if (sVar1 != 8) {
          if (sVar1 == 0xe) {
            ppFVar10 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::operator[]
                                 (&SaveGames,(long)this->Selected);
            bVar4 = FString::IsEmpty(&(*ppFVar10)->Filename);
            if (!bVar4) {
              ppFVar10 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::operator[]
                                   (&SaveGames,(long)this->Selected);
              pcVar9 = FString::GetChars(&(*ppFVar10)->Filename);
              mysnprintf((char *)&EndString,0x200,"File on disk:\n%s",pcVar9);
              if (this->SaveComment != (FBrokenLines *)0x0) {
                V_FreeBrokenLines(this->SaveComment);
              }
              font = SmallFont;
              iVar6 = DCanvas::GetWidth((DCanvas *)screen);
              uVar3 = (long)(iVar6 * 0xd8) / 0x280;
              pFVar8 = V_BreakLines(font,(int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 |
                                                     uVar3 & 0xffffffff) / (long)CleanXfac),
                                    (char *)&EndString,false);
              this->SaveComment = pFVar8;
            }
            return true;
          }
          if (sVar1 != 0x1a) goto LAB_003c2a92;
        }
        FString::FString(&local_230);
        pcVar9 = FStringTable::operator()(&GStrings,"MNU_DELETESG");
        ppFVar10 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::operator[]
                             (&SaveGames,(long)this->Selected);
        pFVar2 = *ppFVar10;
        pcVar11 = FStringTable::operator()(&GStrings,"PRESSYN");
        FString::Format(&local_230,"%s\x1cJ%s\x1c-?\n\n%s",pcVar9,pFVar2,pcVar11);
        pcVar9 = FString::operator_cast_to_char_(&local_230);
        FName::FName(local_240,NAME_None);
        M_StartMessage(pcVar9,0,local_240);
        FString::~FString(&local_230);
        return true;
      }
    }
    else {
      if (ev->subtype == '\x10') {
        if (0 < this->TopItem) {
          this->TopItem = this->TopItem + -1;
        }
        return true;
      }
      if (ev->subtype == '\x11') {
        iVar6 = this->TopItem;
        uVar7 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames);
        if (iVar6 < (int)(uVar7 - this->listboxRows)) {
          this->TopItem = this->TopItem + 1;
        }
        return true;
      }
    }
  }
LAB_003c2a92:
  bVar4 = DListMenu::Responder(&this->super_DListMenu,ev);
  return bVar4;
}

Assistant:

bool DLoadSaveMenu::Responder (event_t *ev)
{
	if (ev->type == EV_GUI_Event)
	{
		if (ev->subtype == EV_GUI_KeyDown)
		{
			if ((unsigned)Selected < SaveGames.Size())
			{
				switch (ev->data1)
				{
				case GK_F1:
					if (!SaveGames[Selected]->Filename.IsEmpty())
					{
						char workbuf[512];

						mysnprintf (workbuf, countof(workbuf), "File on disk:\n%s", SaveGames[Selected]->Filename.GetChars());
						if (SaveComment != NULL)
						{
							V_FreeBrokenLines (SaveComment);
						}
						SaveComment = V_BreakLines (SmallFont, 216*screen->GetWidth()/640/CleanXfac, workbuf);
					}
					return true;

				case GK_DEL:
				case '\b':
					{
						FString EndString;
						EndString.Format("%s" TEXTCOLOR_WHITE "%s" TEXTCOLOR_NORMAL "?\n\n%s",
							GStrings("MNU_DELETESG"), SaveGames[Selected]->Title, GStrings("PRESSYN"));
						M_StartMessage (EndString, 0);
					}
					return true;
				}
			}
		}
		else if (ev->subtype == EV_GUI_WheelUp)
		{
			if (TopItem > 0) TopItem--;
			return true;
		}
		else if (ev->subtype == EV_GUI_WheelDown)
		{
			if (TopItem < (int)SaveGames.Size() - listboxRows) TopItem++;
			return true;
		}
	}
	return Super::Responder(ev);
}